

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::MethodCallExpr::MethodCallExpr
          (MethodCallExpr *this,Location *loc,shared_ptr<minja::Expression> *obj,
          shared_ptr<minja::VariableExpr> *m,ArgumentsExpression *a)

{
  ArgumentsExpression *in_RDI;
  ArgumentsExpression *in_stack_ffffffffffffffc8;
  
  Expression::Expression((Expression *)in_RDI,(Location *)in_stack_ffffffffffffffc8);
  (in_RDI->args).
  super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_do_evaluate_0041ecf0;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<minja::VariableExpr>::shared_ptr
            ((shared_ptr<minja::VariableExpr> *)in_RDI,
             (shared_ptr<minja::VariableExpr> *)in_stack_ffffffffffffffc8);
  ArgumentsExpression::ArgumentsExpression(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

MethodCallExpr(const Location & loc, std::shared_ptr<Expression> && obj, std::shared_ptr<VariableExpr> && m, ArgumentsExpression && a)
        : Expression(loc), object(std::move(obj)), method(std::move(m)), args(std::move(a)) {}